

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpacceptor.cpp
# Opt level: O0

int __thiscall TCPAcceptor::start(TCPAcceptor *this)

{
  int iVar1;
  long lVar2;
  char *__cp;
  undefined4 local_2c;
  int result;
  int optval;
  sockaddr_in address;
  TCPAcceptor *this_local;
  
  if ((this->m_listening & 1U) == 0) {
    address.sin_zero = (uchar  [8])this;
    iVar1 = socket(2,1,0);
    this->m_lsd = iVar1;
    memset(&result,0,0x10);
    result._0_2_ = 2;
    result._2_2_ = htons((uint16_t)this->m_port);
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 0) {
      optval = 0;
    }
    else {
      __cp = (char *)std::__cxx11::string::c_str();
      inet_pton(2,__cp,&optval);
    }
    local_2c = 1;
    setsockopt(this->m_lsd,1,2,&local_2c,4);
    this_local._4_4_ = bind(this->m_lsd,(sockaddr *)&result,0x10);
    if (this_local._4_4_ == 0) {
      this_local._4_4_ = listen(this->m_lsd,5);
      if (this_local._4_4_ == 0) {
        this->m_listening = true;
      }
      else {
        perror("listen() failed");
      }
    }
    else {
      perror("bind() failed");
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int TCPAcceptor::start()
{
    if (m_listening) {
        return 0;
    }

    m_lsd = socket(PF_INET, SOCK_STREAM, 0);
    struct sockaddr_in address;

    memset(&address, 0, sizeof(address));
    address.sin_family = PF_INET;
    address.sin_port = htons(m_port);
    if (m_address.size() > 0) {
        inet_pton(PF_INET, m_address.c_str(), &(address.sin_addr));
    }
    else {
        address.sin_addr.s_addr = INADDR_ANY;
    }

    int optval = 1;
    setsockopt(m_lsd, SOL_SOCKET, SO_REUSEADDR, &optval, sizeof optval);

    int result = ::bind(m_lsd, (struct sockaddr*)&address, sizeof(address));
    if (result != 0) {
        perror("bind() failed");
        return result;
    }

    result = listen(m_lsd, 5);
    if (result != 0) {
        perror("listen() failed");
        return result;
    }
    m_listening = true;
    return result;
}